

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

HighsStatus __thiscall HEkk::undualize(HEkk *this)

{
  double dVar1;
  double val;
  int iVar2;
  int iVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  HighsStatus HVar5;
  pointer *this_00;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  size_type sVar9;
  undefined8 uVar10;
  vector<double,_std::allocator<double>_> *in_RDI;
  pointer *this_01;
  bool bVar11;
  HighsStatus return_status;
  HighsInt primal_solve_iteration_count;
  bool num_basic_variables_ok;
  HighsInt num_basic_variables;
  HighsInt iEl;
  HighsInt iCol_1;
  HighsSparseMatrix primal_matrix;
  bool ignore_scaling;
  bool dual_basic_1;
  HighsInt dual_variable_1;
  int8_t move_1;
  double upper_1;
  double lower_1;
  HighsInt iRow;
  bool dual_basic;
  HighsInt dual_variable;
  int8_t move;
  double upper;
  double lower;
  HighsInt iCol;
  HighsInt upper_bound_col;
  vector<signed_char,_std::allocator<signed_char>_> *primal_nonbasic_move;
  vector<signed_char,_std::allocator<signed_char>_> *primal_nonbasic_flag;
  vector<int,_std::allocator<int>_> *primal_basic_index;
  vector<signed_char,_std::allocator<signed_char>_> dual_nonbasic_move;
  vector<signed_char,_std::allocator<signed_char>_> dual_nonbasic_flag;
  HighsInt primal_num_tot;
  HighsInt dual_num_col;
  undefined1 in_stack_000038b7;
  HEkk *in_stack_000038b8;
  HighsSparseMatrix *in_stack_fffffffffffffe88;
  HighsLogOptions *log_options_;
  undefined4 in_stack_fffffffffffffe90;
  HighsStatus HVar12;
  value_type in_stack_fffffffffffffe94;
  value_type_conflict2 *in_stack_fffffffffffffe98;
  value_type vVar13;
  undefined4 in_stack_fffffffffffffea0;
  value_type in_stack_fffffffffffffea4;
  value_type in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffea9;
  undefined1 in_stack_fffffffffffffeaa;
  undefined1 in_stack_fffffffffffffeab;
  value_type in_stack_fffffffffffffeac;
  undefined1 in_stack_fffffffffffffead;
  undefined1 in_stack_fffffffffffffeae;
  undefined1 in_stack_fffffffffffffeaf;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  int local_138;
  int local_134;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  vector<signed_char,_std::allocator<signed_char>_> *in_stack_fffffffffffffee0;
  vector<int,_std::allocator<int>_> local_f0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff28;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  value_type local_a9;
  HighsSparseMatrix *in_stack_ffffffffffffff60;
  int local_98;
  value_type local_89;
  int local_78;
  int local_74;
  vector<signed_char,_std::allocator<signed_char>_> local_30;
  int local_18;
  int local_14;
  HighsStatus local_4;
  
  if (((ulong)in_RDI[0x18e].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start & 0x100) == 0) {
    local_4 = kOk;
  }
  else {
    local_14 = *(int *)&in_RDI[0x166].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    local_18 = *(int *)&in_RDI[0x250].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish +
               *(int *)((long)&in_RDI[0x250].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 4);
    std::vector<signed_char,_std::allocator<signed_char>_>::vector
              (in_stack_fffffffffffffee0,
               (vector<signed_char,_std::allocator<signed_char>_> *)
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    std::vector<signed_char,_std::allocator<signed_char>_>::vector
              (in_stack_fffffffffffffee0,
               (vector<signed_char,_std::allocator<signed_char>_> *)
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    pvVar4 = in_RDI + 0x1ba;
    this_01 = &in_RDI[0x1bb].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
    this_00 = &in_RDI[0x1bc].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
    std::vector<signed_char,_std::allocator<signed_char>_>::assign
              ((vector<signed_char,_std::allocator<signed_char>_> *)
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               (size_type)in_stack_fffffffffffffe88,(value_type_conflict *)0x769f66);
    std::vector<signed_char,_std::allocator<signed_char>_>::assign
              ((vector<signed_char,_std::allocator<signed_char>_> *)
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               (size_type)in_stack_fffffffffffffe88,(value_type_conflict *)0x769f88);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_RDI,
               CONCAT17(in_stack_fffffffffffffeaf,
                        CONCAT16(in_stack_fffffffffffffeae,
                                 CONCAT15(in_stack_fffffffffffffead,
                                          CONCAT14(in_stack_fffffffffffffeac,
                                                   CONCAT13(in_stack_fffffffffffffeab,
                                                            CONCAT12(in_stack_fffffffffffffeaa,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffea9,
                                                  in_stack_fffffffffffffea8))))))));
    local_74 = *(int *)((long)&in_RDI[0x250].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 4);
    for (local_78 = 0;
        local_78 <
        *(int *)&in_RDI[0x250].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish; local_78 = local_78 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[0x252].super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_finish,(long)local_78);
      dVar1 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[0x253].super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_finish,(long)local_78);
      val = *pvVar6;
      local_89 = -99;
      pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         (&local_30,(long)(local_14 + local_78));
      bVar11 = *pvVar7 == '\0';
      if ((dVar1 != val) || (NAN(dVar1) || NAN(val))) {
        in_stack_fffffffffffffeaf = highs_isInfinity(-dVar1);
        if ((bool)in_stack_fffffffffffffeaf) {
          in_stack_fffffffffffffead = highs_isInfinity(val);
          if ((bool)in_stack_fffffffffffffead) {
            if (bVar11) {
              local_89 = '\0';
            }
          }
          else if (bVar11) {
            local_89 = -1;
          }
        }
        else {
          in_stack_fffffffffffffeae = highs_isInfinity(val);
          if ((bool)in_stack_fffffffffffffeae) {
            if (bVar11) {
              local_89 = '\x01';
            }
          }
          else {
            if (bVar11) {
              local_89 = '\x01';
            }
            else {
              pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                                 (&local_30,(long)local_74);
              bVar11 = *pvVar7 == '\0';
              if (bVar11) {
                local_89 = -1;
              }
            }
            local_74 = local_74 + 1;
          }
        }
      }
      else if (bVar11) {
        local_89 = '\0';
      }
      if (bVar11) {
        pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)this_01,
                            (long)local_78);
        *pvVar7 = '\x01';
        pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)this_00,
                            (long)local_78);
        *pvVar7 = local_89;
        in_stack_fffffffffffffeac = local_89;
      }
      else {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   in_stack_fffffffffffffe98);
        pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)this_01,
                            (long)local_78);
        *pvVar7 = '\0';
        pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)this_00,
                            (long)local_78);
        *pvVar7 = '\0';
      }
    }
    for (local_98 = 0;
        local_98 <
        *(int *)((long)&in_RDI[0x250].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish + 4); local_98 = local_98 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[0x254].super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_finish,(long)local_98);
      in_stack_ffffffffffffff60 = (HighsSparseMatrix *)*pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[0x255].super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_finish,(long)local_98);
      dVar1 = *pvVar6;
      local_a9 = -99;
      pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         (&local_30,(long)local_98);
      bVar11 = *pvVar7 == '\0';
      if (((double)in_stack_ffffffffffffff60 != dVar1) ||
         (NAN((double)in_stack_ffffffffffffff60) || NAN(dVar1))) {
        in_stack_fffffffffffffeab = highs_isInfinity(-(double)in_stack_ffffffffffffff60);
        if ((bool)in_stack_fffffffffffffeab) {
          in_stack_fffffffffffffea9 = highs_isInfinity(dVar1);
          if ((bool)in_stack_fffffffffffffea9) {
            if (bVar11) {
              local_a9 = '\0';
            }
          }
          else if (bVar11) {
            local_a9 = '\x01';
          }
        }
        else {
          in_stack_fffffffffffffeaa = highs_isInfinity(dVar1);
          if ((bool)in_stack_fffffffffffffeaa) {
            if (bVar11) {
              local_a9 = -1;
            }
          }
          else {
            if (bVar11) {
              local_a9 = -1;
            }
            else {
              pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                                 (&local_30,(long)local_74);
              bVar11 = *pvVar7 == '\0';
              if (bVar11) {
                local_a9 = '\x01';
              }
            }
            local_74 = local_74 + 1;
          }
        }
      }
      else if (bVar11) {
        local_a9 = '\0';
      }
      if (bVar11) {
        pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)this_01,
                            (long)(*(int *)&in_RDI[0x250].
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_finish + local_98));
        *pvVar7 = '\x01';
        pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)this_00,
                            (long)(*(int *)&in_RDI[0x250].
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_finish + local_98));
        *pvVar7 = local_a9;
        in_stack_fffffffffffffea8 = local_a9;
      }
      else {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   (value_type_conflict2 *)in_stack_fffffffffffffe88);
        pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)this_01,
                            (long)(*(int *)&in_RDI[0x250].
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_finish + local_98));
        *pvVar7 = '\0';
        pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)this_00,
                            (long)(*(int *)&in_RDI[0x250].
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_finish + local_98));
        *pvVar7 = '\0';
      }
    }
    if (*(int *)&in_RDI[0x170].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish == 1) {
      *(undefined4 *)
       &in_RDI[0x170].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = 0xffffffff;
    }
    else {
      *(undefined4 *)
       &in_RDI[0x170].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = 1;
    }
    *(undefined4 *)
     &in_RDI[0x166].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish =
         *(undefined4 *)
          &in_RDI[0x250].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
    *(undefined4 *)
     ((long)&in_RDI[0x166].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 4) =
         *(undefined4 *)
          ((long)&in_RDI[0x250].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 4);
    in_RDI[0x170].super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         in_RDI[0x251].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    HighsSparseMatrix::HighsSparseMatrix
              ((HighsSparseMatrix *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_RDI,
               CONCAT17(in_stack_fffffffffffffeaf,
                        CONCAT16(in_stack_fffffffffffffeae,
                                 CONCAT15(in_stack_fffffffffffffead,
                                          CONCAT14(in_stack_fffffffffffffeac,
                                                   CONCAT13(in_stack_fffffffffffffeab,
                                                            CONCAT12(in_stack_fffffffffffffeaa,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffea9,
                                                  in_stack_fffffffffffffea8))))))));
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_RDI,
               CONCAT17(in_stack_fffffffffffffeaf,
                        CONCAT16(in_stack_fffffffffffffeae,
                                 CONCAT15(in_stack_fffffffffffffead,
                                          CONCAT14(in_stack_fffffffffffffeac,
                                                   CONCAT13(in_stack_fffffffffffffeab,
                                                            CONCAT12(in_stack_fffffffffffffeaa,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffea9,
                                                  in_stack_fffffffffffffea8))))))));
    std::vector<double,_std::allocator<double>_>::resize
              (in_RDI,CONCAT17(in_stack_fffffffffffffeaf,
                               CONCAT16(in_stack_fffffffffffffeae,
                                        CONCAT15(in_stack_fffffffffffffead,
                                                 CONCAT14(in_stack_fffffffffffffeac,
                                                          CONCAT13(in_stack_fffffffffffffeab,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffeaa,
                                                  CONCAT11(in_stack_fffffffffffffea9,
                                                           in_stack_fffffffffffffea8))))))));
    for (local_134 = 0;
        local_134 <
        *(int *)((long)&in_RDI[0x250].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish + 4) + 1; local_134 = local_134 + 1) {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &in_RDI[0x16c].super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_finish,(long)local_134);
      in_stack_fffffffffffffea4 = *pvVar8;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&stack0xfffffffffffffee0,
                          (long)local_134);
      *pvVar8 = in_stack_fffffffffffffea4;
    }
    for (local_138 = 0;
        local_138 <
        *(int *)&in_RDI[0x250].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage; local_138 = local_138 + 1) {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &in_RDI[0x16e].super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_finish,(long)local_138);
      in_stack_fffffffffffffe94 = *pvVar8;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_f0,(long)local_138);
      *pvVar8 = in_stack_fffffffffffffe94;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[0x16f].super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_finish,(long)local_138);
      vVar13 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff28,
                          (long)local_138);
      *pvVar6 = vVar13;
    }
    HighsSparseMatrix::operator=
              ((HighsSparseMatrix *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88);
    HighsSparseMatrix::ensureColwise(in_stack_ffffffffffffff60);
    sVar9 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)
                       &(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish);
    if ((int)sVar9 !=
        *(int *)((long)&in_RDI[0x250].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish + 4)) {
      printf("HEkk::undualize: Have %d basic variables, not %d\n",sVar9 & 0xffffffff,
             (ulong)*(uint *)((long)&in_RDI[0x250].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish + 4));
    }
    clearEkkDualize((HEkk *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    *(undefined1 *)
     ((long)&in_RDI[0x18e].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + 1) = 0;
    *(undefined1 *)
     ((long)&in_RDI[0x18e].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + 4) = 1;
    *(undefined1 *)
     ((long)&in_RDI[0x18e].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + 5) = 0;
    *(undefined1 *)
     ((long)&in_RDI[0x18e].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + 6) = 0;
    *(undefined1 *)
     &in_RDI[0x18e].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = 0;
    iVar2 = *(int *)&in_RDI[0x24a].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    HVar5 = solve(in_stack_000038b8,(bool)in_stack_000038b7);
    iVar3 = *(int *)&in_RDI[0x24a].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    log_options_ = (HighsLogOptions *)
                   ((in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish + 0x70);
    HVar12 = HVar5;
    uVar10 = std::__cxx11::string::c_str();
    highsLogUser(log_options_,kInfo,
                 "Solving the primal LP (%s) using the optimal basis of its dual required %d simplex iterations\n"
                 ,uVar10,(ulong)(uint)(iVar3 - iVar2));
    local_4 = HVar5;
    HighsSparseMatrix::~HighsSparseMatrix
              ((HighsSparseMatrix *)CONCAT44(in_stack_fffffffffffffe94,HVar12));
    std::vector<signed_char,_std::allocator<signed_char>_>::~vector
              ((vector<signed_char,_std::allocator<signed_char>_> *)
               CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    std::vector<signed_char,_std::allocator<signed_char>_>::~vector
              ((vector<signed_char,_std::allocator<signed_char>_> *)
               CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  }
  return local_4;
}

Assistant:

HighsStatus HEkk::undualize() {
  if (!this->status_.is_dualized) return HighsStatus::kOk;
  HighsInt dual_num_col = lp_.num_col_;
  HighsInt primal_num_tot = original_num_col_ + original_num_row_;
  // These two aren't used (yet)
  // vector<double>& dual_work_dual = info_.workDual_;
  // vector<double>& primal_work_value = info_.workValue_;
  // Take copies of the nonbasic information for the dual LP, since
  // its values will be over-written in constructing the corresponding
  // data for the primal problem
  vector<int8_t> dual_nonbasic_flag = basis_.nonbasicFlag_;
  vector<int8_t> dual_nonbasic_move = basis_.nonbasicMove_;
  vector<HighsInt>& primal_basic_index = basis_.basicIndex_;
  vector<int8_t>& primal_nonbasic_flag = basis_.nonbasicFlag_;
  vector<int8_t>& primal_nonbasic_move = basis_.nonbasicMove_;
  basis_.nonbasicFlag_.assign(primal_num_tot, kIllegalFlagValue);
  basis_.nonbasicMove_.assign(primal_num_tot, kIllegalMoveValue);
  basis_.basicIndex_.resize(0);
  // The number of dual rows is the number of primal columns, so all
  // dual basic variables are nonbasic in the primal problem.
  //
  // If there are extra dual columns due to upper bounds on boxed
  // primal variables/constraints, there will be an excess of dual
  // nonbasic variables for the required primal basic variables.
  //
  // For each pair of dual variables associated with a boxed primal
  // variable/constraint:
  //
  // * If one is basic then it yields a nonbasic primal variable, at
  //   a bound given by the basic dual
  //
  // * If both are nonbasic, then they yield a basic primal variable
  //
  // Keep track of the dual column added to handle upper bounds on
  // boxed variables/constraints
  HighsInt upper_bound_col = original_num_row_;
  for (HighsInt iCol = 0; iCol < original_num_col_; iCol++) {
    const double lower = original_col_lower_[iCol];
    const double upper = original_col_upper_[iCol];
    int8_t move = kIllegalMoveValue;
    HighsInt dual_variable = dual_num_col + iCol;
    bool dual_basic = dual_nonbasic_flag[dual_variable] == kNonbasicFlagFalse;
    if (lower == upper) {
      // Fixed
      if (dual_basic) move = kNonbasicMoveZe;
    } else if (!highs_isInfinity(-lower)) {
      // Finite lower bound so boxed or lower
      if (!highs_isInfinity(upper)) {
        // Finite upper bound so boxed
        if (dual_basic) {
          // Primal variable is nonbasic at its lower bound
          move = kNonbasicMoveUp;
        } else {
          // Look at the corresponding dual variable for the upper bound
          dual_variable = upper_bound_col;
          dual_basic = dual_nonbasic_flag[dual_variable] == kNonbasicFlagFalse;
          if (dual_basic) {
            // Primal variable is nonbasic at its upper bound
            move = kNonbasicMoveDn;
          }
        }
        upper_bound_col++;
      } else {
        // Lower (since upper bound is infinite)
        if (dual_basic) move = kNonbasicMoveUp;
      }
    } else if (!highs_isInfinity(upper)) {
      // Upper
      if (dual_basic) move = kNonbasicMoveDn;
    } else {
      // FREE
      //
      // Dual activity a^Ty is fixed by cost, implying dual for primal
      // column (slack for dual row) is fixed at zero
      if (dual_basic) {
        assert(4 == 0);
        move = kNonbasicMoveZe;
      }
    }
    if (dual_basic) {
      // Primal nonbasic column from basic dual row
      assert(move != kIllegalMoveValue);
      primal_nonbasic_flag[iCol] = kNonbasicFlagTrue;
      primal_nonbasic_move[iCol] = move;
    } else {
      // Primal basic column from nonbasic dual row
      primal_basic_index.push_back(iCol);
      primal_nonbasic_flag[iCol] = kNonbasicFlagFalse;
      primal_nonbasic_move[iCol] = 0;
    }
  }
  for (HighsInt iRow = 0; iRow < original_num_row_; iRow++) {
    double lower = original_row_lower_[iRow];
    double upper = original_row_upper_[iRow];
    int8_t move = kIllegalMoveValue;
    HighsInt dual_variable = iRow;
    bool dual_basic = dual_nonbasic_flag[dual_variable] == kNonbasicFlagFalse;
    if (lower == upper) {
      // Equality constraint
      //
      // Dual variable has primal RHS as cost and is free
      if (dual_basic) {
        move = kNonbasicMoveZe;
      }
    } else if (!highs_isInfinity(-lower)) {
      // Finite lower bound so boxed or lower
      if (!highs_isInfinity(upper)) {
        // Finite upper bound so boxed
        if (dual_basic) {
          // Primal variable is nonbasic at its lower bound
          move = kNonbasicMoveDn;
        } else {
          // Look at the corresponding dual variable for the upper bound
          dual_variable = upper_bound_col;
          dual_basic = dual_nonbasic_flag[dual_variable] == kNonbasicFlagFalse;
          if (dual_basic) {
            // Primal variable is nonbasic at its upper bound
            move = kNonbasicMoveUp;
          }
        }
        upper_bound_col++;
      } else {
        // Lower (since upper bound is infinite)
        if (dual_basic) {
          move = kNonbasicMoveDn;
        }
      }
    } else if (!highs_isInfinity(upper)) {
      // Upper
      if (dual_basic) {
        move = kNonbasicMoveUp;
      }
    } else {
      // FREE
      if (dual_basic) {
        assert(14 == 0);
        move = kNonbasicMoveZe;
      }
      // Shouldn't get free rows, but handle them anyway
    }
    if (dual_basic) {
      // Primal nonbasic column from basic dual row
      assert(move != kIllegalMoveValue);
      primal_nonbasic_flag[original_num_col_ + iRow] = kNonbasicFlagTrue;
      primal_nonbasic_move[original_num_col_ + iRow] = move;
    } else {
      // Primal basic column from nonbasic dual row
      primal_basic_index.push_back(original_num_col_ + iRow);
      primal_nonbasic_flag[original_num_col_ + iRow] = kNonbasicFlagFalse;
      primal_nonbasic_move[original_num_col_ + iRow] = 0;
    }
  }
  const bool ignore_scaling = true;
  if (!ignore_scaling) {
    // Flip any scale factors
    if (lp_.scale_.has_scaling) {
      std::vector<double> temp_scale = lp_.scale_.row;
      lp_.scale_.row = lp_.scale_.col;
      lp_.scale_.col = temp_scale;
      lp_.scale_.col.resize(original_num_col_);
      lp_.scale_.row.resize(original_num_row_);
      lp_.scale_.num_col = original_num_col_;
      lp_.scale_.num_row = original_num_row_;
    }
  }
  // Change optimization sense
  if (lp_.sense_ == ObjSense::kMinimize) {
    lp_.sense_ = ObjSense::kMaximize;
  } else {
    lp_.sense_ = ObjSense::kMinimize;
  }
  // Flip LP dimensions
  lp_.num_col_ = original_num_col_;
  lp_.num_row_ = original_num_row_;
  // Restore the original offset
  lp_.offset_ = original_offset_;
  // Copy back the costs and bounds
  lp_.col_cost_ = original_col_cost_;
  lp_.col_lower_ = original_col_lower_;
  lp_.col_upper_ = original_col_upper_;
  lp_.row_lower_ = original_row_lower_;
  lp_.row_upper_ = original_row_upper_;
  // The primal constraint matrix is available row-wise as the first
  // original_num_row_ vectors of the dual constraint matrix
  HighsSparseMatrix primal_matrix;
  primal_matrix.start_.resize(original_num_row_ + 1);
  primal_matrix.index_.resize(original_num_nz_);
  primal_matrix.value_.resize(original_num_nz_);

  for (HighsInt iCol = 0; iCol < original_num_row_ + 1; iCol++)
    primal_matrix.start_[iCol] = lp_.a_matrix_.start_[iCol];
  for (HighsInt iEl = 0; iEl < original_num_nz_; iEl++) {
    primal_matrix.index_[iEl] = lp_.a_matrix_.index_[iEl];
    primal_matrix.value_[iEl] = lp_.a_matrix_.value_[iEl];
  }
  primal_matrix.num_col_ = original_num_col_;
  primal_matrix.num_row_ = original_num_row_;
  primal_matrix.format_ = MatrixFormat::kRowwise;
  // Copy the row-wise primal LP constraint matrix and transpose it.
  // ToDo Make this more efficient
  lp_.a_matrix_ = primal_matrix;
  lp_.a_matrix_.ensureColwise();
  // Some sanity checks
  assert(lp_.num_col_ == original_num_col_);
  assert(lp_.num_row_ == original_num_row_);
  assert(lp_.a_matrix_.numNz() == original_num_nz_);
  HighsInt num_basic_variables = primal_basic_index.size();
  bool num_basic_variables_ok = num_basic_variables == original_num_row_;
  if (!num_basic_variables_ok)
    printf("HEkk::undualize: Have %d basic variables, not %d\n",
           (int)num_basic_variables, (int)original_num_row_);
  assert(num_basic_variables_ok);

  // Clear the data retained when solving dual LP
  clearEkkDualize();
  status_.is_dualized = false;
  // Now solve with this basis. Should just be a case of reinverting
  // and re-solving for optimal primal and dual values, but
  // numerically marginal LPs will need clean-up
  status_.has_basis = true;
  status_.has_ar_matrix = false;
  status_.has_nla = false;
  status_.has_invert = false;
  HighsInt primal_solve_iteration_count = -iteration_count_;
  HighsStatus return_status = solve();
  primal_solve_iteration_count += iteration_count_;
  //  if (primal_solve_iteration_count)
  highsLogUser(options_->log_options, HighsLogType::kInfo,
               "Solving the primal LP (%s) using the optimal basis of its dual "
               "required %d simplex iterations\n",
               lp_.model_name_.c_str(), (int)primal_solve_iteration_count);
  return return_status;
}